

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalUpdateCounts(Fts3Expr *pExpr,int nCol)

{
  u32 *puVar1;
  u32 *puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  byte *p;
  byte *pbVar7;
  int local_2c;
  
  do {
    if (pExpr == (Fts3Expr *)0x0) {
      return;
    }
    if ((pExpr->pPhrase != (Fts3Phrase *)0x0) &&
       (pbVar7 = (byte *)(pExpr->pPhrase->doclist).pList, pbVar7 != (byte *)0x0)) {
      local_2c = 0;
      do {
        bVar6 = 0;
        iVar4 = 0;
        while( true ) {
          p = pbVar7 + 1;
          if ((*pbVar7 & 0xfe) == 0 && bVar6 == 0) break;
          iVar4 = iVar4 + (uint)(bVar6 == 0);
          bVar6 = *pbVar7 & 0x80;
          pbVar7 = p;
        }
        puVar2 = pExpr->aMI;
        puVar1 = puVar2 + (long)(local_2c * 3) + 1;
        *puVar1 = *puVar1 + iVar4;
        puVar2 = puVar2 + (long)(local_2c * 3) + 2;
        *puVar2 = (*puVar2 + 1) - (uint)(iVar4 == 0);
        if (*pbVar7 == 0) break;
        uVar5 = 1;
        iVar4 = (int)(char)*p;
        if ((char)*p < '\0') {
          uVar3 = sqlite3Fts3GetVarint32((char *)p,&local_2c);
          uVar5 = (ulong)uVar3;
          iVar4 = local_2c;
        }
        local_2c = iVar4;
        pbVar7 = p + uVar5;
      } while (local_2c < nCol);
    }
    fts3EvalUpdateCounts(pExpr->pLeft,nCol);
    pExpr = pExpr->pRight;
  } while( true );
}

Assistant:

static void fts3EvalUpdateCounts(Fts3Expr *pExpr, int nCol){
  if( pExpr ){
    Fts3Phrase *pPhrase = pExpr->pPhrase;
    if( pPhrase && pPhrase->doclist.pList ){
      int iCol = 0;
      char *p = pPhrase->doclist.pList;

      do{
        u8 c = 0;
        int iCnt = 0;
        while( 0xFE & (*p | c) ){
          if( (c&0x80)==0 ) iCnt++;
          c = *p++ & 0x80;
        }

        /* aMI[iCol*3 + 1] = Number of occurrences
        ** aMI[iCol*3 + 2] = Number of rows containing at least one instance
        */
        pExpr->aMI[iCol*3 + 1] += iCnt;
        pExpr->aMI[iCol*3 + 2] += (iCnt>0);
        if( *p==0x00 ) break;
        p++;
        p += fts3GetVarint32(p, &iCol);
      }while( iCol<nCol );
    }

    fts3EvalUpdateCounts(pExpr->pLeft, nCol);
    fts3EvalUpdateCounts(pExpr->pRight, nCol);
  }
}